

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<bool>::Resize(RepeatedField<bool> *this,int new_size,bool *value)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pvVar2 = this->arena_or_elements_;
    bVar1 = *value;
    for (lVar3 = (long)this->current_size_; new_size != lVar3; lVar3 = lVar3 + 1) {
      *(bool *)((long)pvVar2 + lVar3) = bVar1;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}